

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_IgnoreField_TrumpsCompareWithFields_Test::
TestBody(MessageDifferencerTest_IgnoreField_TrumpsCompareWithFields_Test *this)

{
  char *in_R9;
  pointer *__ptr;
  FieldDescriptor *rc;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  FieldDescriptor *c;
  TestField msg1;
  TestField msg2;
  MessageDifferencer differencer;
  AssertHelper local_2e0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_2d8;
  internal local_2d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2c8;
  FieldDescriptor *local_2c0;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_2b8;
  string local_298;
  FieldDescriptor *local_278;
  undefined1 local_270 [88];
  undefined1 local_218 [88];
  undefined1 local_1c0 [16];
  Message local_1b0 [26];
  
  proto2_unittest::TestField::TestField((TestField *)local_270,(Arena *)0x0);
  proto2_unittest::TestField::TestField((TestField *)local_218,(Arena *)0x0);
  local_270._72_4_ = 3;
  local_270[0x10] = local_270[0x10] | 2;
  RepeatedField<int>::Add((RepeatedField<int> *)(local_270 + 0x18),1);
  RepeatedField<int>::Add((RepeatedField<int> *)(local_270 + 0x18),2);
  local_218._72_4_ = 3;
  local_218[0x10] = local_218[0x10] | 2;
  RepeatedField<int>::Add((RepeatedField<int> *)(local_218 + 0x18),1);
  RepeatedField<int>::Add((RepeatedField<int> *)(local_218 + 0x18),3);
  local_1c0._0_8_ = local_1b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"c","");
  local_278 = GetFieldDescriptor((anon_unknown_0 *)local_270,(Message *)local_1c0._0_8_,
                                 (string *)local_1c0._8_8_);
  if ((Message *)local_1c0._0_8_ != local_1b0) {
    operator_delete((void *)local_1c0._0_8_,
                    (long)local_1b0[0].super_MessageLite._vptr_MessageLite + 1);
  }
  local_1c0._0_8_ = local_1b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"rc","");
  local_2c0 = GetFieldDescriptor((anon_unknown_0 *)local_270,(Message *)local_1c0._0_8_,
                                 (string *)local_1c0._8_8_);
  if ((Message *)local_1c0._0_8_ != local_1b0) {
    operator_delete((void *)local_1c0._0_8_,
                    (long)local_1b0[0].super_MessageLite._vptr_MessageLite + 1);
  }
  local_2b8.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (FieldDescriptor **)0x0;
  local_2b8.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (FieldDescriptor **)0x0;
  std::
  vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
  ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
            ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
              *)&local_2b8,(iterator)0x0,&local_278);
  if (local_2b8.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_2b8.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
    ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
              ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                *)&local_2b8,
               (iterator)
               local_2b8.
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_2c0);
  }
  else {
    *local_2b8.
     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
     ._M_impl.super__Vector_impl_data._M_finish = local_2c0;
    local_2b8.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_2b8.
         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  util::MessageDifferencer::MessageDifferencer((MessageDifferencer *)local_1c0);
  util::MessageDifferencer::IgnoreField((MessageDifferencer *)local_1c0,local_2c0);
  util::MessageDifferencer::set_scope((MessageDifferencer *)local_1c0,FULL);
  local_2d0[0] = (internal)
                 util::MessageDifferencer::CompareWithFields
                           ((MessageDifferencer *)local_1c0,(Message *)local_270,
                            (Message *)local_218,&local_2b8,&local_2b8);
  local_2c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_2d0[0]) {
    testing::Message::Message((Message *)&local_2d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_298,local_2d0,
               (AssertionResult *)"differencer.CompareWithFields(msg1, msg2, fields, fields)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xb0d,local_298._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_2e0,(Message *)&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if (local_2d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2d8._M_head_impl + 8))();
    }
    if (local_2c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_2c8,local_2c8);
    }
  }
  util::MessageDifferencer::set_scope((MessageDifferencer *)local_1c0,PARTIAL);
  local_2d0[0] = (internal)
                 util::MessageDifferencer::CompareWithFields
                           ((MessageDifferencer *)local_1c0,(Message *)local_270,
                            (Message *)local_218,&local_2b8,&local_2b8);
  local_2c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_2d0[0]) {
    testing::Message::Message((Message *)&local_2d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_298,local_2d0,
               (AssertionResult *)"differencer.CompareWithFields(msg1, msg2, fields, fields)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xb10,local_298._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_2e0,(Message *)&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if (local_2d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2d8._M_head_impl + 8))();
    }
    if (local_2c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_2c8,local_2c8);
    }
  }
  util::MessageDifferencer::~MessageDifferencer((MessageDifferencer *)local_1c0);
  if (local_2b8.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b8.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2b8.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b8.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  proto2_unittest::TestField::~TestField((TestField *)local_218);
  proto2_unittest::TestField::~TestField((TestField *)local_270);
  return;
}

Assistant:

TEST(MessageDifferencerTest, IgnoreField_TrumpsCompareWithFields) {
  proto2_unittest::TestField msg1;
  proto2_unittest::TestField msg2;

  msg1.set_c(3);
  msg1.add_rc(1);
  msg1.add_rc(2);

  msg2.set_c(3);
  msg2.add_rc(1);
  msg2.add_rc(3);

  const FieldDescriptor* c = GetFieldDescriptor(msg1, "c");
  const FieldDescriptor* rc = GetFieldDescriptor(msg1, "rc");

  std::vector<const FieldDescriptor*> fields;
  fields.push_back(c);
  fields.push_back(rc);

  util::MessageDifferencer differencer;
  differencer.IgnoreField(rc);

  differencer.set_scope(util::MessageDifferencer::FULL);
  EXPECT_TRUE(differencer.CompareWithFields(msg1, msg2, fields, fields));

  differencer.set_scope(util::MessageDifferencer::PARTIAL);
  EXPECT_TRUE(differencer.CompareWithFields(msg1, msg2, fields, fields));
}